

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_objects.cxx
# Opt level: O2

void __thiscall xray_re::xr_scene_objects::load(xr_scene_objects *this,xr_reader *r)

{
  uint uVar1;
  uint *puVar2;
  size_t sVar3;
  char *__assertion;
  
  xr_scene_revision::load(&(this->super_xr_scene_part).m_revision,r);
  sVar3 = xr_reader::find_chunk(r,2);
  if (sVar3 == 0) {
    __assertion = "0";
    uVar1 = 0x6d;
  }
  else {
    puVar2 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
    uVar1 = *puVar2;
    xr_scene::load_objects((this->super_xr_scene_part).m_scene,r,3,&this->m_objects);
    if ((long)(this->m_objects).
              super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_objects).
              super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == (ulong)uVar1) {
      return;
    }
    __assertion = "num_objects == m_objects.size()";
    uVar1 = 0x72;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_objects.cxx"
                ,uVar1,"virtual void xray_re::xr_scene_objects::load(xr_reader &)");
}

Assistant:

void xr_scene_objects::load(xr_reader& r)
{
	revision().load(r);
	if (!r.find_chunk(TOOLS_CHUNK_COUNT))
		xr_not_expected();
	size_t num_objects = r.r_u32();
	r.debug_find_chunk();

	scene().load_objects(r, TOOLS_CHUNK_OBJECTS, m_objects);
	xr_assert(num_objects == m_objects.size());
}